

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_walk(command *cmd)

{
  loc grid;
  player *ppVar1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  trap_kind_conflict *ptVar5;
  loc lVar6;
  wchar_t dir;
  wchar_t local_2c;
  
  _Var2 = player_is_trapsafe(player);
  wVar4 = cmd_get_direction((command_conflict *)cmd,"direction",&local_2c,false);
  if (wVar4 == L'\0') {
    lVar6.x = (player->grid).x;
    lVar6.y = (player->grid).y;
    _Var3 = square_iswebbed(cave,lVar6);
    if (_Var3) {
      ptVar5 = lookup_trap("web");
      msg("You clear the web.");
      if (ptVar5 == (trap_kind_conflict *)0x0) {
        __assert_fail("web",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-cave.c"
                      ,0x5ec,"void do_cmd_walk(struct command *)");
      }
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      square_remove_all_traps_of_type((chunk *)cave,grid,ptVar5->tidx);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
    else {
      _Var3 = player_confuse_dir(player,&local_2c,false);
      ppVar1 = player;
      if (_Var3) {
        player->upkeep->energy_use = (uint)z_info->move_energy;
      }
      lVar6 = (loc)loc_sum(ppVar1->grid,(loc_conflict)ddgrid[local_2c]);
      _Var3 = do_cmd_walk_test(player,lVar6);
      if (_Var3) {
        wVar4 = energy_per_move(player);
        player->upkeep->energy_use = wVar4;
        _Var3 = square_isdisarmabletrap(cave,lVar6);
        move_player(local_2c,!_Var3 || !_Var2);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_walk(struct command *cmd)
{
	struct loc grid;
	int dir;
	bool trapsafe = player_is_trapsafe(player) ? true : false;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
		return;

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		struct trap_kind *web = lookup_trap("web");

		msg("You clear the web.");
		assert(web);
		square_remove_all_traps_of_type(cave, player->grid, web->tidx);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}

	/* Apply confusion if necessary */
	/* Confused movements use energy no matter what */
	if (player_confuse_dir(player, &dir, false))
		player->upkeep->energy_use = z_info->move_energy;
	
	/* Verify walkability */
	grid = loc_sum(player->grid, ddgrid[dir]);
	if (!do_cmd_walk_test(player, grid))
		return;

	player->upkeep->energy_use = energy_per_move(player);

	/* Attempt to disarm unless it's a trap and we're trapsafe */
	move_player(dir, !(square_isdisarmabletrap(cave, grid) && trapsafe));
}